

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 UVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  
  uVar12 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  pBVar2 = (ms->window).base;
  uVar24 = ms->nextToUpdate;
  uVar22 = (ulong)uVar24;
  uVar14 = (uint)((long)ip - (long)pBVar2);
  cVar5 = (char)(ms->cParams).hashLog;
  bVar10 = cVar5 - 2;
  lVar11 = 1L << (bVar10 & 0x3f);
  uVar17 = 3 << (bVar10 & 0x1f);
  uVar18 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar23 = uVar14 - uVar17;
  if (uVar14 < uVar17 || uVar23 == 0) {
    uVar23 = uVar24;
  }
  pUVar3 = ms->hashTable;
  pUVar4 = ms->chainTable;
  uVar7 = (long)ip - (long)pBVar2 & 0xffffffff;
  for (; uVar22 < uVar7; uVar22 = uVar22 + 1) {
    switch((ms->cParams).minMatch) {
    case 5:
      lVar8 = -0x30e4432345000000;
      break;
    case 6:
      lVar8 = -0x30e4432340650000;
      break;
    case 7:
      lVar8 = -0x30e44323405a9d00;
      break;
    case 8:
      uVar9 = *(long *)(pBVar2 + uVar22) * -0x30e44323485a9b9d;
      goto LAB_01bb5dfa;
    default:
      uVar17 = (uint)(*(int *)(pBVar2 + uVar22) * -0x61c8864f) >> (0x22U - cVar5 & 0x1f);
      goto LAB_01bb5e02;
    }
    uVar9 = lVar8 * *(long *)(pBVar2 + uVar22);
LAB_01bb5dfa:
    uVar17 = (uint)(uVar9 >> (0x42U - cVar5 & 0x3f));
LAB_01bb5e02:
    if (uVar23 <= uVar22) {
      pUVar3[lVar11 + (ulong)((U32)uVar22 - uVar23)] = pUVar3[uVar17];
    }
    pUVar3[uVar17] = (U32)uVar22;
  }
  if (uVar12 < uVar14 - uVar24) {
    uVar24 = uVar14 - uVar12;
  }
  uVar12 = 0xff;
  if (uVar18 < 0xff) {
    uVar12 = uVar18;
  }
  uVar17 = 1 << (bVar10 & 0x1f);
  uVar9 = (ulong)uVar17;
  uVar18 = 0;
  for (uVar22 = 0; uVar22 != uVar9; uVar22 = uVar22 + 1) {
    uVar6 = 0;
    puVar16 = pUVar3 + uVar22;
    for (uVar13 = 0; (uVar19 = *puVar16, uVar23 <= uVar19 && (uVar13 < 3)); uVar13 = uVar13 + 1) {
      uVar6 = uVar6 + (uVar19 < uVar24);
      puVar16 = pUVar3 + lVar11 + (ulong)(uVar19 - uVar23);
    }
    uVar15 = uVar18;
    uVar21 = 0;
    if (uVar13 == 3) {
      uVar20 = 0;
      uVar13 = uVar18;
      while( true ) {
        uVar15 = uVar13;
        uVar21 = uVar12;
        if ((uVar12 == uVar20) ||
           ((uVar15 = uVar18 + uVar20, uVar19 < uVar24 &&
            ((uVar21 = uVar20, uVar19 == 0 || (uVar6 = uVar6 + 1, 3 < uVar6)))))) goto LAB_01bb5ee5;
        uVar13 = uVar13 + 1;
        pUVar4[uVar15] = uVar19;
        if (uVar19 < uVar23) break;
        uVar19 = pUVar3[lVar11 + (ulong)(uVar19 - uVar23)];
        uVar20 = uVar20 + 1;
      }
      uVar15 = uVar13;
      uVar21 = uVar20 + 1;
    }
LAB_01bb5ee5:
    uVar18 = uVar15;
    uVar6 = uVar18 * 0x100 + uVar21 * -0xff;
    if (uVar21 == 0) {
      uVar6 = 0;
    }
    pUVar3[uVar22] = uVar6;
  }
  uVar17 = uVar17 * 4;
  while( true ) {
    uVar17 = uVar17 - 4;
    iVar25 = (int)uVar9;
    uVar24 = iVar25 - 1;
    uVar9 = (ulong)uVar24;
    if (iVar25 == 0) break;
    UVar1 = pUVar3[uVar9];
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      pUVar3[(ulong)uVar17 + lVar11] = 0;
    }
    pUVar3[(ulong)(uVar24 * 4) + 3] = UVar1;
  }
  uVar22 = (ulong)ms->nextToUpdate;
  do {
    if (uVar7 <= uVar22) {
      ms->nextToUpdate = uVar14;
      return;
    }
    switch((ms->cParams).minMatch) {
    case 5:
      uVar9 = *(long *)(pBVar2 + uVar22) * -0x30e4432345000000;
      break;
    case 6:
      uVar9 = *(long *)(pBVar2 + uVar22) * -0x30e4432340650000;
      break;
    case 7:
      uVar9 = *(long *)(pBVar2 + uVar22) * -0x30e44323405a9d00;
      break;
    case 8:
      uVar9 = *(long *)(pBVar2 + uVar22) * -0x30e44323485a9b9d;
      break;
    default:
      uVar24 = (uint)(*(int *)(pBVar2 + uVar22) * -0x61c8864f) >> (0x22U - cVar5 & 0x1f);
      goto LAB_01bb5ff1;
    }
    uVar24 = (uint)(uVar9 >> (0x42U - cVar5 & 0x3f));
LAB_01bb5ff1:
    for (lVar11 = 0; lVar11 != -2; lVar11 = lVar11 + -1) {
      pUVar3[(ulong)(uVar24 & 0x3fffffff) * 4 + lVar11 + 2] = pUVar3[uVar24 * 4 + 1 + (int)lVar11];
    }
    pUVar3[uVar24 * 4] = (U32)uVar22;
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}